

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cpu_count_math_cpus(int n_cpu)

{
  bool bVar1;
  int iVar2;
  int in_EDI;
  int cpu;
  int result;
  int in_stack_00000084;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_10 = 0;
  while( true ) {
    if (in_EDI <= local_10) {
      return local_c;
    }
    iVar2 = pin_cpu(in_stack_00000084);
    if (iVar2 != 0) break;
    bVar1 = is_running_on_efficiency_core();
    if (!bVar1) {
      local_10 = local_10 + 1;
      local_c = local_c + 1;
    }
    local_10 = local_10 + 1;
  }
  return -1;
}

Assistant:

static int cpu_count_math_cpus(int n_cpu) {
    int result = 0;
    for (int cpu = 0; cpu < n_cpu; ++cpu) {
        if (pin_cpu(cpu)) {
            return -1;
        }
        if (is_running_on_efficiency_core()) {
            continue; // efficiency cores harm lockstep threading
        }
        ++cpu; // hyperthreading isn't useful for linear algebra
        ++result;
    }
    return result;
}